

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall c4::yml::Parser::_move_scalar_from_top(Parser *this)

{
  State *pSVar1;
  pfn_error p_Var2;
  Location LVar3;
  Location LVar4;
  Location loc;
  Location loc_00;
  bool bVar5;
  error_flags eVar6;
  size_t sVar7;
  Parser *in_RDI;
  char msg_1 [33];
  char msg [42];
  State *prev;
  undefined4 in_stack_fffffffffffffe78;
  flag_t in_stack_fffffffffffffe7c;
  Parser *in_stack_fffffffffffffe80;
  char *in_stack_fffffffffffffe88;
  Location *in_stack_fffffffffffffe90;
  char *in_stack_fffffffffffffe98;
  Location *in_stack_fffffffffffffea0;
  Location *this_00;
  stack<c4::yml::Parser::State,_16UL> *msg_00;
  undefined8 in_stack_fffffffffffffee0;
  Parser *in_stack_fffffffffffffee8;
  undefined8 in_stack_fffffffffffffef0;
  undefined8 in_stack_fffffffffffffef8;
  size_t in_stack_ffffffffffffff00;
  Location local_f8;
  undefined8 local_d0;
  Parser *pPStack_c8;
  char *local_c0;
  Location *pLStack_b8;
  char *local_b0;
  char local_a8 [48];
  State *local_78;
  undefined8 local_68;
  flag_t fStack_64;
  Parser *pPStack_60;
  char *local_58;
  Location *pLStack_50;
  char *local_48;
  stack<c4::yml::Parser::State,_16UL> *local_40;
  undefined8 local_38;
  Parser *pPStack_30;
  char *local_28;
  Location *pLStack_20;
  char *local_18;
  long local_10;
  stack<c4::yml::Parser::State,_16UL> *local_8;
  
  sVar7 = detail::stack<c4::yml::Parser::State,_16UL>::size(&in_RDI->m_stack);
  if (1 < sVar7) {
    msg_00 = &in_RDI->m_stack;
    local_10 = 1;
    local_8 = msg_00;
    if ((in_RDI->m_stack).m_size < 2) {
      eVar6 = get_error_flags();
      if (((eVar6 & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
        trap_instruction();
      }
      Location::Location(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                         (size_t)in_stack_fffffffffffffe80,
                         CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
      in_stack_fffffffffffffe78 = (undefined4)local_38;
      in_stack_fffffffffffffe7c = (flag_t)((ulong)local_38 >> 0x20);
      loc.super_LineCol.line = (size_t)in_stack_fffffffffffffee8;
      loc.super_LineCol.offset = in_stack_fffffffffffffee0;
      loc.super_LineCol.col = in_stack_fffffffffffffef0;
      loc.name.str = (char *)in_stack_fffffffffffffef8;
      loc.name.len = in_stack_ffffffffffffff00;
      error<25ul>((char (*) [25])msg_00,loc);
      in_stack_fffffffffffffe80 = pPStack_30;
      in_stack_fffffffffffffe88 = local_28;
      in_stack_fffffffffffffe90 = pLStack_20;
      in_stack_fffffffffffffe98 = local_18;
    }
    local_78 = msg_00->m_stack + ((msg_00->m_size - 1) - local_10);
    pSVar1 = in_RDI->m_state;
    local_40 = &in_RDI->m_stack;
    if ((in_RDI->m_stack).m_size == 0) {
      eVar6 = get_error_flags();
      if (((eVar6 & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
        trap_instruction();
      }
      Location::Location(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                         (size_t)in_stack_fffffffffffffe80,
                         CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
      loc_00.super_LineCol.line = (size_t)in_stack_fffffffffffffee8;
      loc_00.super_LineCol.offset = in_stack_fffffffffffffee0;
      loc_00.super_LineCol.col = in_stack_fffffffffffffef0;
      loc_00.name.str = (char *)in_stack_fffffffffffffef8;
      loc_00.name.len = in_stack_ffffffffffffff00;
      error<25ul>((char (*) [25])msg_00,loc_00);
      in_stack_fffffffffffffe7c = fStack_64;
      in_stack_fffffffffffffe80 = pPStack_60;
      in_stack_fffffffffffffe88 = local_58;
      in_stack_fffffffffffffe90 = pLStack_50;
      in_stack_fffffffffffffe98 = local_48;
    }
    if (pSVar1 != (in_RDI->m_stack).m_stack + ((in_RDI->m_stack).m_size - 1)) {
      memcpy(local_a8,"check failed: (m_state == &m_stack.top())",0x2a);
      eVar6 = get_error_flags();
      if (((eVar6 & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
        trap_instruction();
      }
      p_Var2 = (in_RDI->m_stack).m_callbacks.m_error;
      Location::Location(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                         (size_t)in_stack_fffffffffffffe90,(size_t)in_stack_fffffffffffffe88,
                         (size_t)in_stack_fffffffffffffe80);
      in_stack_fffffffffffffe7c = (flag_t)((ulong)local_d0 >> 0x20);
      LVar3.super_LineCol.line = (size_t)pPStack_c8;
      LVar3.super_LineCol.offset = local_d0;
      LVar3.super_LineCol.col = (size_t)local_c0;
      LVar3.name.str = (char *)pLStack_b8;
      LVar3.name.len = (size_t)local_b0;
      (*p_Var2)(local_a8,0x2a,LVar3,(in_RDI->m_stack).m_callbacks.m_user_data);
      in_stack_fffffffffffffe80 = pPStack_c8;
      in_stack_fffffffffffffe88 = local_c0;
      in_stack_fffffffffffffe90 = pLStack_b8;
      in_stack_fffffffffffffe98 = local_b0;
    }
    if (in_RDI->m_state == local_78) {
      memcpy(&local_f8,"check failed: (m_state != &prev)",0x21);
      eVar6 = get_error_flags();
      if (((eVar6 & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
        trap_instruction();
      }
      p_Var2 = (in_RDI->m_stack).m_callbacks.m_error;
      this_00 = &local_f8;
      Location::Location(this_00,in_stack_fffffffffffffe98,(size_t)in_stack_fffffffffffffe90,
                         (size_t)in_stack_fffffffffffffe88,(size_t)in_stack_fffffffffffffe80);
      in_stack_fffffffffffffe80 = in_stack_fffffffffffffee8;
      in_stack_fffffffffffffe7c = (flag_t)((ulong)in_stack_fffffffffffffee0 >> 0x20);
      LVar4.super_LineCol.line = (size_t)in_stack_fffffffffffffe80;
      LVar4.super_LineCol.offset = in_stack_fffffffffffffee0;
      LVar4.super_LineCol.col = in_stack_fffffffffffffef0;
      LVar4.name.str = (char *)in_stack_fffffffffffffef8;
      LVar4.name.len = in_stack_ffffffffffffff00;
      (*p_Var2)((char *)this_00,0x21,LVar4,(in_RDI->m_stack).m_callbacks.m_user_data);
    }
    if ((local_78->flags & 0x200U) != 0) {
      add_flags(in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c);
      pSVar1 = in_RDI->m_state;
      (pSVar1->scalar).str = (local_78->scalar).str;
      (pSVar1->scalar).len = (local_78->scalar).len;
      rem_flags(in_RDI,0x600,local_78);
      basic_substring<const_char>::clear(&local_78->scalar);
    }
  }
  return;
}

Assistant:

void Parser::_move_scalar_from_top()
{
    if(m_stack.size() < 2) return;
    State &prev = m_stack.top(1);
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_state == &m_stack.top());
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_state != &prev);
    if(prev.flags & SSCL)
    {
        _c4dbgpf("moving scalar '{}' from state[{}] to state[{}] (overwriting '{}')", prev.scalar, &prev-m_stack.begin(), m_state-m_stack.begin(), m_state->scalar);
        add_flags(prev.flags & (SSCL | QSCL));
        m_state->scalar = prev.scalar;
        rem_flags(SSCL | QSCL, &prev);
        prev.scalar.clear();
    }
}